

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

bool __thiscall
xmrig::SelfSelectClient::parseResponse(SelfSelectClient *this,int64_t id,Value *result,Value *error)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  Value *obj;
  undefined4 extraout_var_00;
  String *pSVar5;
  char *pcVar6;
  Type this_00;
  uint64_t height;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RCX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar7 [12];
  char *field;
  char **__end1;
  char **__begin1;
  char *(*__range1) [5];
  Value *in_stack_00000138;
  SelfSelectClient *in_stack_00000140;
  char *in_stack_ffffffffffffff90;
  Job *this_01;
  Ch *in_stack_ffffffffffffff98;
  Job *this_02;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffa8;
  String *local_38;
  bool local_1;
  
  if (in_RSI == -1) {
    local_1 = false;
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(in_RCX);
    iVar3 = (int)in_RSI;
    if (bVar1) {
      auVar7 = (**(code **)(*in_RDI + 0x50))();
      iVar3 = Pool::daemon(auVar7._0_8_,iVar3,auVar7._8_4_);
      pSVar5 = Url::url((Url *)CONCAT44(extraout_var,iVar3));
      pcVar4 = String::data(pSVar5);
      obj = (Value *)Json::getString(in_stack_ffffffffffffffa8,pcVar4,in_stack_ffffffffffffff98);
      uVar2 = Json::getInt(obj,pcVar4,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      Log::print(ERR,"[%s] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",pcVar4,obj,
                 (ulong)uVar2);
      local_1 = false;
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject(in_RDX);
      if (bVar1) {
        for (local_38 = (String *)&required_fields; local_38 != &kLocalHost;
            local_38 = (String *)&local_38->m_size) {
          pcVar4 = local_38->m_data;
          iVar3 = (int)pcVar4;
          bVar1 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::HasMember(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          if (!bVar1) {
            auVar7 = (**(code **)(*in_RDI + 0x50))();
            iVar3 = Pool::daemon(auVar7._0_8_,iVar3,auVar7._8_4_);
            pSVar5 = Url::url((Url *)CONCAT44(extraout_var_00,iVar3));
            pcVar6 = String::data(pSVar5);
            Log::print(ERR,"[%s] required field \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m not found",pcVar6,
                       pcVar4);
            return false;
          }
        }
        this_02 = (Job *)(in_RDI + 9);
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(in_RDX,(char *)in_RCX);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(this_00);
        bVar1 = Job::setBlob(this_02,in_stack_ffffffffffffff90);
        if (bVar1) {
          this_01 = (Job *)(in_RDI + 9);
          height = Json::getUint64(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                                   (uint64_t)this_02);
          Job::setHeight(this_01,height);
          submitBlockTemplate(in_stack_00000140,in_stack_00000138);
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool xmrig::SelfSelectClient::parseResponse(int64_t id, rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == -1) {
        return false;
    }

    if (error.IsObject()) {
        LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", pool().daemon().url().data(), Json::getString(error, "message"), Json::getInt(error, "code"));

        return false;
    }

    if (!result.IsObject()) {
        return false;
    }

    for (auto field : required_fields) {
        if (!result.HasMember(field)) {
            LOG_ERR("[%s] required field " RED_BOLD("\"%s\"") RED_S " not found", pool().daemon().url().data(), field);

            return false;
        }
    }

    if (!m_job.setBlob(result[kBlockhashingBlob].GetString())) {
        return false;
    }

    m_job.setHeight(Json::getUint64(result, kHeight));

    submitBlockTemplate(result);

    return true;
}